

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int xmlParserNsLookup(xmlParserCtxtPtr ctxt,xmlHashedString *prefix,xmlParserNsBucket **bucketPtr)

{
  uint uVar1;
  xmlParserNsData *pxVar2;
  int iVar3;
  xmlParserNsBucket *pxVar4;
  uint uVar5;
  ulong uVar6;
  xmlParserNsBucket *pxVar7;
  
  pxVar2 = ctxt->nsdb;
  if (prefix->name == (xmlChar *)0x0) {
    iVar3 = pxVar2->defaultNsIndex;
  }
  else {
    uVar1 = pxVar2->hashSize;
    if (uVar1 != 0) {
      uVar6 = (ulong)(uVar1 - 1 & prefix->hashValue);
      pxVar4 = pxVar2->hash + uVar6;
      pxVar7 = (xmlParserNsBucket *)0x0;
      while (pxVar4->hashValue != 0) {
        iVar3 = pxVar4->index;
        if ((long)iVar3 == 0x7fffffff) {
          if (pxVar7 == (xmlParserNsBucket *)0x0) {
            pxVar7 = pxVar4;
          }
        }
        else if ((pxVar4->hashValue == prefix->hashValue) &&
                (ctxt->nsTab[(long)iVar3 * 2] == prefix->name)) {
          if (bucketPtr == (xmlParserNsBucket **)0x0) {
            return iVar3;
          }
          *bucketPtr = pxVar4;
          return iVar3;
        }
        uVar5 = (int)uVar6 + 1;
        pxVar4 = pxVar4 + 1;
        if (uVar5 == uVar1) {
          pxVar4 = pxVar2->hash;
        }
        uVar6 = (ulong)uVar5;
        if (uVar5 == uVar1) {
          uVar6 = 0;
        }
      }
      if (bucketPtr != (xmlParserNsBucket **)0x0) {
        if (pxVar7 != (xmlParserNsBucket *)0x0) {
          pxVar4 = pxVar7;
        }
        *bucketPtr = pxVar4;
      }
    }
    iVar3 = 0x7fffffff;
  }
  return iVar3;
}

Assistant:

static int
xmlParserNsLookup(xmlParserCtxtPtr ctxt, const xmlHashedString *prefix,
                  xmlParserNsBucket **bucketPtr) {
    xmlParserNsBucket *bucket, *tombstone;
    unsigned index, hashValue;

    if (prefix->name == NULL)
        return(ctxt->nsdb->defaultNsIndex);

    if (ctxt->nsdb->hashSize == 0)
        return(INT_MAX);

    hashValue = prefix->hashValue;
    index = hashValue & (ctxt->nsdb->hashSize - 1);
    bucket = &ctxt->nsdb->hash[index];
    tombstone = NULL;

    while (bucket->hashValue) {
        if (bucket->index == INT_MAX) {
            if (tombstone == NULL)
                tombstone = bucket;
        } else if (bucket->hashValue == hashValue) {
            if (ctxt->nsTab[bucket->index * 2] == prefix->name) {
                if (bucketPtr != NULL)
                    *bucketPtr = bucket;
                return(bucket->index);
            }
        }

        index++;
        bucket++;
        if (index == ctxt->nsdb->hashSize) {
            index = 0;
            bucket = ctxt->nsdb->hash;
        }
    }

    if (bucketPtr != NULL)
        *bucketPtr = tombstone ? tombstone : bucket;
    return(INT_MAX);
}